

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_add_timecondition(Curl_easy *data,dynbuf *req)

{
  uchar uVar1;
  char *pcVar2;
  int local_f4;
  size_t local_d8;
  size_t len;
  char *condp;
  char datestr [80];
  undefined1 local_70 [4];
  CURLcode result;
  tm keeptime;
  tm *tm;
  dynbuf *req_local;
  Curl_easy *data_local;
  
  if ((data->set).timecondition == '\0') {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    datestr._76_4_ = Curl_gmtime((data->set).timevalue,(tm *)local_70);
    if (datestr._76_4_ == CURLE_OK) {
      keeptime.tm_zone = local_70;
      uVar1 = (data->set).timecondition;
      if (uVar1 == '\x01') {
        len = (size_t)anon_var_dwarf_1428a20;
        local_d8 = 0x11;
      }
      else if (uVar1 == '\x02') {
        len = (size_t)anon_var_dwarf_1428a2b;
        local_d8 = 0x13;
      }
      else {
        if (uVar1 != '\x03') {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        len = (size_t)anon_var_dwarf_1428a36;
        local_d8 = 0xd;
      }
      pcVar2 = Curl_checkheaders(data,(char *)len,local_d8);
      if (pcVar2 == (char *)0x0) {
        if (*(int *)(keeptime.tm_zone + 0x18) == 0) {
          local_f4 = 6;
        }
        else {
          local_f4 = *(int *)(keeptime.tm_zone + 0x18) + -1;
        }
        curl_msnprintf((char *)&condp,0x50,"%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",len,
                       Curl_wkday[local_f4],(ulong)*(uint *)(keeptime.tm_zone + 0xc),
                       Curl_month[*(int *)(keeptime.tm_zone + 0x10)],
                       *(int *)(keeptime.tm_zone + 0x14) + 0x76c,
                       *(undefined4 *)(keeptime.tm_zone + 8),*(undefined4 *)(keeptime.tm_zone + 4),
                       *(undefined4 *)keeptime.tm_zone);
        data_local._4_4_ = Curl_dyn_add(req,(char *)&condp);
      }
      else {
        data_local._4_4_ = CURLE_OK;
      }
    }
    else {
      Curl_failf(data,"Invalid TIMEVALUE");
      data_local._4_1_ = datestr[0x4c];
      data_local._5_1_ = datestr[0x4d];
      data_local._6_1_ = datestr[0x4e];
      data_local._7_1_ = datestr[0x4f];
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_add_timecondition(struct Curl_easy *data,
#ifndef USE_HYPER
                                struct dynbuf *req
#else
                                void *req
#endif
  )
{
  const struct tm *tm;
  struct tm keeptime;
  CURLcode result;
  char datestr[80];
  const char *condp;
  size_t len;

  if(data->set.timecondition == CURL_TIMECOND_NONE)
    /* no condition was asked for */
    return CURLE_OK;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  switch(data->set.timecondition) {
  default:
    return CURLE_BAD_FUNCTION_ARGUMENT;

  case CURL_TIMECOND_IFMODSINCE:
    condp = "If-Modified-Since";
    len = 17;
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    condp = "If-Unmodified-Since";
    len = 19;
    break;
  case CURL_TIMECOND_LASTMOD:
    condp = "Last-Modified";
    len = 13;
    break;
  }

  if(Curl_checkheaders(data, condp, len)) {
    /* A custom header was specified; it will be sent instead. */
    return CURLE_OK;
  }

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  msnprintf(datestr, sizeof(datestr),
            "%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
            condp,
            Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
            tm->tm_mday,
            Curl_month[tm->tm_mon],
            tm->tm_year + 1900,
            tm->tm_hour,
            tm->tm_min,
            tm->tm_sec);

#ifndef USE_HYPER
  result = Curl_dyn_add(req, datestr);
#else
  result = Curl_hyper_header(data, req, datestr);
#endif

  return result;
}